

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_test.c
# Opt level: O0

MPP_RET test_mpp_enc_cfg_setup(MpiEncMultiCtxInfo *info)

{
  RK_U32 RVar1;
  uint uVar2;
  int local_20c;
  MppFrameFormat local_1fc;
  MppFrameColorSpace local_1ec;
  RK_S32 local_1dc;
  MppFrameColorPrimaries local_1cc;
  MppFrameColorTransferCharacteristic local_1bc;
  MppFrameFormat local_1ac;
  MppFrameColorSpace local_19c;
  RK_S32 local_18c;
  MppFrameColorRange local_17c;
  MppFrameChromaFormat local_16c;
  MppFrameChromaDownSampleMode local_15c;
  MppFrameColorRange local_14c;
  MppFrameColorPrimaries local_13c;
  MppFrameColorTransferCharacteristic local_12c;
  MppFrameFormat local_11c;
  MppFrameColorSpace local_10c;
  RK_S32 local_fc;
  int local_e4;
  int local_d4;
  int local_c4;
  int local_b4;
  int local_a4;
  int local_94;
  RK_U32 local_74;
  char *pcStack_70;
  RK_U32 sei_mode;
  RcApiBrief rc_api_brief;
  RK_U32 constraint_set;
  RK_S32 fix_qp;
  MppEncRefCfg ref;
  RK_U32 gop_mode;
  RK_U32 flip;
  RK_U32 mirroring;
  RK_U32 rotation;
  MPP_RET ret;
  RK_U32 quiet;
  MppEncCfg cfg;
  MppCtx ctx;
  MppApi *mpi;
  MpiEncTestData *p;
  MpiEncTestArgs *cmd;
  MpiEncMultiCtxInfo *info_local;
  
  p = (MpiEncTestData *)info->cmd;
  mpi = (MppApi *)&info->ctx;
  ctx = (info->ctx).mpi;
  cfg = ((MpiEncTestData *)mpi)->ctx;
  _ret = (info->ctx).cfg;
  rotation = (p->rc_cfg).rc_mode;
  ref._0_4_ = (info->ctx).gop_mode;
  _constraint_set = (MppEncRefCfg)0x0;
  if ((info->ctx).fps_in_den == 0) {
    (info->ctx).fps_in_den = 1;
  }
  if ((info->ctx).fps_in_num == 0) {
    (info->ctx).fps_in_num = 0x1e;
  }
  if ((info->ctx).fps_out_den == 0) {
    (info->ctx).fps_out_den = 1;
  }
  if ((info->ctx).fps_out_num == 0) {
    (info->ctx).fps_out_num = 0x1e;
  }
  if ((info->ctx).bps == 0) {
    (info->ctx).bps =
         ((info->ctx).width * (info->ctx).height >> 3) *
         ((info->ctx).fps_out_num / (info->ctx).fps_out_den);
  }
  cmd = (MpiEncTestArgs *)info;
  mpp_enc_cfg_set_s32(_ret,"prep:width",(info->ctx).width);
  mpp_enc_cfg_set_s32(_ret,"prep:height",mpi[0x19].reserv[3]);
  mpp_enc_cfg_set_s32(_ret,"prep:hor_stride",mpi[0x19].reserv[4]);
  mpp_enc_cfg_set_s32(_ret,"prep:ver_stride",mpi[0x19].reserv[5]);
  mpp_enc_cfg_set_s32(_ret,"prep:format",mpi[0x19].reserv[6]);
  mpp_enc_cfg_set_s32(_ret,"prep:range",2);
  mpp_env_get_u32("mirroring",&gop_mode);
  mpp_env_get_u32("rotation",&flip,0);
  mpp_env_get_u32("flip",(long)&ref + 4,0);
  mpp_enc_cfg_set_s32(_ret,"prep:mirroring",gop_mode);
  mpp_enc_cfg_set_s32(_ret,"prep:rotation",flip);
  mpp_enc_cfg_set_s32(_ret,"prep:flip",ref._4_4_);
  mpp_enc_cfg_set_s32(_ret,"rc:mode",*(undefined4 *)&mpi[0x1a].enqueue);
  mpp_enc_cfg_set_u32(_ret,"rc:max_reenc_times",0);
  mpp_enc_cfg_set_u32(_ret,"rc:super_mode",0);
  mpp_enc_cfg_set_s32(_ret,"rc:fps_in_flex",*(undefined4 *)((long)&mpi[0x1a].isp + 4));
  mpp_enc_cfg_set_s32(_ret,"rc:fps_in_num",*(undefined4 *)((long)&mpi[0x1a].isp_put_frame + 4));
  mpp_enc_cfg_set_s32(_ret,"rc:fps_in_denom",*(undefined4 *)&mpi[0x1a].isp_put_frame);
  mpp_enc_cfg_set_s32(_ret,"rc:fps_out_flex",*(undefined4 *)&mpi[0x1a].isp_get_frame);
  mpp_enc_cfg_set_s32(_ret,"rc:fps_out_num",*(undefined4 *)&mpi[0x1a].poll);
  mpp_enc_cfg_set_s32(_ret,"rc:fps_out_denom",*(undefined4 *)((long)&mpi[0x1a].isp_get_frame + 4));
  mpp_enc_cfg_set_u32(_ret,"rc:drop_mode",0);
  mpp_enc_cfg_set_u32(_ret,"rc:drop_thd",0x14);
  mpp_enc_cfg_set_u32(_ret,"rc:drop_gap",1);
  mpp_enc_cfg_set_s32(_ret,"rc:bps_target",*(undefined4 *)((long)&mpi[0x1a].poll + 4));
  switch(*(undefined4 *)&mpi[0x1a].enqueue) {
  case 0:
  case 3:
    if (*(int *)&mpi[0x1a].dequeue == 0) {
      local_b4 = (*(int *)((long)&mpi[0x1a].poll + 4) * 0x11) / 0x10;
    }
    else {
      local_b4 = *(int *)&mpi[0x1a].dequeue;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:bps_max",local_b4);
    if (*(int *)((long)&mpi[0x1a].dequeue + 4) == 0) {
      local_c4 = *(int *)((long)&mpi[0x1a].poll + 4) / 0x10;
    }
    else {
      local_c4 = *(int *)((long)&mpi[0x1a].dequeue + 4);
    }
    mpp_enc_cfg_set_s32(_ret,"rc:bps_min",local_c4);
    break;
  case 1:
    if (*(int *)&mpi[0x1a].dequeue == 0) {
      local_94 = (*(int *)((long)&mpi[0x1a].poll + 4) * 0x11) / 0x10;
    }
    else {
      local_94 = *(int *)&mpi[0x1a].dequeue;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:bps_max",local_94);
    if (*(int *)((long)&mpi[0x1a].dequeue + 4) == 0) {
      local_a4 = (*(int *)((long)&mpi[0x1a].poll + 4) * 0xf) / 0x10;
    }
    else {
      local_a4 = *(int *)((long)&mpi[0x1a].dequeue + 4);
    }
    mpp_enc_cfg_set_s32(_ret,"rc:bps_min",local_a4);
    break;
  case 2:
    break;
  default:
    if (*(int *)&mpi[0x1a].dequeue == 0) {
      local_d4 = (*(int *)((long)&mpi[0x1a].poll + 4) * 0x11) / 0x10;
    }
    else {
      local_d4 = *(int *)&mpi[0x1a].dequeue;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:bps_max",local_d4);
    if (*(int *)((long)&mpi[0x1a].dequeue + 4) == 0) {
      local_e4 = (*(int *)((long)&mpi[0x1a].poll + 4) * 0xf) / 0x10;
    }
    else {
      local_e4 = *(int *)((long)&mpi[0x1a].dequeue + 4);
    }
    mpp_enc_cfg_set_s32(_ret,"rc:bps_min",local_e4);
  }
  RVar1 = mpi[0x19].reserv[7];
  if (RVar1 == 8) {
    if ((p->prep_cfg).max_height == 0) {
      local_1dc = 0x50;
    }
    else {
      local_1dc = (p->prep_cfg).max_height;
    }
    mpp_enc_cfg_set_s32(_ret,"jpeg:q_factor",local_1dc);
    if ((p->prep_cfg).color == MPP_FRAME_SPC_RGB) {
      local_1ec = 99;
    }
    else {
      local_1ec = (p->prep_cfg).color;
    }
    mpp_enc_cfg_set_s32(_ret,"jpeg:qf_max",local_1ec);
    if ((p->prep_cfg).format == MPP_FMT_YUV420SP) {
      local_1fc = MPP_FMT_YUV420SP_10BIT;
    }
    else {
      local_1fc = (p->prep_cfg).format;
    }
    mpp_enc_cfg_set_s32(_ret,"jpeg:qf_min",local_1fc);
  }
  else if (RVar1 == 9) {
    if ((p->prep_cfg).max_height == 0) {
      local_18c = 0x28;
    }
    else {
      local_18c = (p->prep_cfg).max_height;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:qp_init",local_18c);
    if ((p->prep_cfg).color == MPP_FRAME_SPC_RGB) {
      local_19c = 0x7f;
    }
    else {
      local_19c = (p->prep_cfg).color;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:qp_max",local_19c);
    if ((p->prep_cfg).format == MPP_FMT_YUV420SP) {
      local_1ac = MPP_FMT_YUV420SP;
    }
    else {
      local_1ac = (p->prep_cfg).format;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:qp_min",local_1ac);
    if ((p->prep_cfg).colortrc == MPP_FRAME_TRC_RESERVED0) {
      local_1bc = 0x7f;
    }
    else {
      local_1bc = (p->prep_cfg).colortrc;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:qp_max_i",local_1bc);
    if ((p->prep_cfg).colorprim == MPP_FRAME_PRI_RESERVED0) {
      local_1cc = MPP_FRAME_PRI_RESERVED0;
    }
    else {
      local_1cc = (p->prep_cfg).colorprim;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:qp_min_i",local_1cc);
    mpp_enc_cfg_set_s32(_ret,"rc:qp_ip",6);
  }
  else if (RVar1 == 0x1000004) {
    uVar2 = *(uint *)&mpi[0x1a].enqueue;
    if (1 < uVar2) {
      if (uVar2 == 2) {
        rc_api_brief._12_4_ = (p->prep_cfg).max_height;
        mpp_enc_cfg_set_s32(_ret,"rc:qp_init",rc_api_brief._12_4_);
        mpp_enc_cfg_set_s32(_ret,"rc:qp_max",rc_api_brief._12_4_);
        mpp_enc_cfg_set_s32(_ret,"rc:qp_min",rc_api_brief._12_4_);
        mpp_enc_cfg_set_s32(_ret,"rc:qp_max_i",rc_api_brief._12_4_);
        mpp_enc_cfg_set_s32(_ret,"rc:qp_min_i",rc_api_brief._12_4_);
        mpp_enc_cfg_set_s32(_ret,"rc:qp_ip",0);
        mpp_enc_cfg_set_s32(_ret,"rc:fqp_min_i",rc_api_brief._12_4_);
        mpp_enc_cfg_set_s32(_ret,"rc:fqp_max_i",rc_api_brief._12_4_);
        mpp_enc_cfg_set_s32(_ret,"rc:fqp_min_p",rc_api_brief._12_4_);
        mpp_enc_cfg_set_s32(_ret,"rc:fqp_max_p",rc_api_brief._12_4_);
        goto LAB_00107eb9;
      }
      if (1 < uVar2 - 3) {
        _mpp_log_l(2,"mpi_enc_test","unsupport encoder rc mode %d\n","test_mpp_enc_cfg_setup",
                   *(undefined4 *)&mpi[0x1a].enqueue);
        goto LAB_00107eb9;
      }
    }
    if ((p->prep_cfg).max_height == 0) {
      local_fc = -1;
    }
    else {
      local_fc = (p->prep_cfg).max_height;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:qp_init",local_fc);
    if ((p->prep_cfg).color == MPP_FRAME_SPC_RGB) {
      local_10c = 0x33;
    }
    else {
      local_10c = (p->prep_cfg).color;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:qp_max",local_10c);
    if ((p->prep_cfg).format == MPP_FMT_YUV420SP) {
      local_11c = MPP_FMT_YUV422_UYVY;
    }
    else {
      local_11c = (p->prep_cfg).format;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:qp_min",local_11c);
    if ((p->prep_cfg).colortrc == MPP_FRAME_TRC_RESERVED0) {
      local_12c = 0x33;
    }
    else {
      local_12c = (p->prep_cfg).colortrc;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:qp_max_i",local_12c);
    if ((p->prep_cfg).colorprim == MPP_FRAME_PRI_RESERVED0) {
      local_13c = MPP_FRAME_PRI_SMPTEST428_1;
    }
    else {
      local_13c = (p->prep_cfg).colorprim;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:qp_min_i",local_13c);
    mpp_enc_cfg_set_s32(_ret,"rc:qp_ip",2);
    if ((p->prep_cfg).range == MPP_FRAME_RANGE_UNSPECIFIED) {
      local_14c = 10;
    }
    else {
      local_14c = (p->prep_cfg).range;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:fqp_min_i",local_14c);
    if ((p->prep_cfg).chroma_ds_mode == MPP_FRAME_CHROMA_DOWN_SAMPLE_MODE_NONE) {
      local_15c = 0x2d;
    }
    else {
      local_15c = (p->prep_cfg).chroma_ds_mode;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:fqp_max_i",local_15c);
    if ((p->prep_cfg).format_out == MPP_CHROMA_UNSPECIFIED) {
      local_16c = 10;
    }
    else {
      local_16c = (p->prep_cfg).format_out;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:fqp_min_p",local_16c);
    if ((p->prep_cfg).range_out == MPP_FRAME_RANGE_UNSPECIFIED) {
      local_17c = 0x2d;
    }
    else {
      local_17c = (p->prep_cfg).range_out;
    }
    mpp_enc_cfg_set_s32(_ret,"rc:fqp_max_p",local_17c);
  }
LAB_00107eb9:
  mpp_enc_cfg_set_s32(_ret,"codec:type",mpi[0x19].reserv[7]);
  RVar1 = mpi[0x19].reserv[7];
  if (RVar1 == 7) {
    mpp_enc_cfg_set_s32(_ret,"h264:profile",100);
    mpp_enc_cfg_set_s32(_ret,"h264:level",0x28);
    mpp_enc_cfg_set_s32(_ret,"h264:cabac_en",1);
    mpp_enc_cfg_set_s32(_ret,"h264:cabac_idc",0);
    mpp_enc_cfg_set_s32(_ret,"h264:trans8x8",1);
    mpp_env_get_u32("constraint_set",&rc_api_brief.type,0);
    if ((rc_api_brief.type & 0x3f0000) != MPP_VIDEO_CodingUnused) {
      mpp_enc_cfg_set_s32(_ret,"h264:constraint_set",rc_api_brief.type);
    }
  }
  else if (1 < RVar1 - 8) {
    if (RVar1 == 0x1000004) {
      mpp_enc_cfg_set_s32(_ret,"h265:diff_cu_qp_delta_depth",
                          *(undefined4 *)((long)&mpi[0x1a].control + 4));
    }
    else {
      _mpp_log_l(2,"mpi_enc_test","unsupport encoder coding type %d\n","test_mpp_enc_cfg_setup",
                 mpi[0x19].reserv[7]);
    }
  }
  *(undefined4 *)&mpi[0x1a].encode_put_frame = 0;
  *(undefined4 *)((long)&mpi[0x1a].encode_put_frame + 4) = 0;
  *(undefined4 *)&mpi[0x1a].encode_get_packet = 0;
  mpp_env_get_u32("split_mode",&mpi[0x1a].encode_put_frame,0);
  mpp_env_get_u32("split_arg",(undefined1 *)((long)&mpi[0x1a].encode_put_frame + 4),0);
  mpp_env_get_u32("split_out",&mpi[0x1a].encode_get_packet,0);
  if (*(int *)&mpi[0x1a].encode_put_frame != 0) {
    if (rotation == 0) {
      _mpp_log_l(4,"mpi_enc_test","%p split mode %d arg %d out %d\n",0,cfg,
                 *(undefined4 *)&mpi[0x1a].encode_put_frame,
                 *(undefined4 *)((long)&mpi[0x1a].encode_put_frame + 4),
                 *(undefined4 *)&mpi[0x1a].encode_get_packet);
    }
    mpp_enc_cfg_set_s32(_ret,"split:mode",*(undefined4 *)&mpi[0x1a].encode_put_frame);
    mpp_enc_cfg_set_s32(_ret,"split:arg",*(undefined4 *)((long)&mpi[0x1a].encode_put_frame + 4));
    mpp_enc_cfg_set_s32(_ret,"split:out",*(undefined4 *)&mpi[0x1a].encode_get_packet);
  }
  if (*(int *)&mpi[0x1a].reset == 0) {
    local_20c = *(int *)&mpi[0x1a].poll << 1;
  }
  else {
    local_20c = *(int *)&mpi[0x1a].reset;
  }
  mpp_enc_cfg_set_s32(_ret,"rc:gop",local_20c);
  mpp_env_get_u32("gop_mode",&ref,(RK_S32)ref);
  if ((RK_S32)ref != 0) {
    mpp_enc_ref_cfg_init(&constraint_set);
    if (*(int *)((long)&mpi[0x1a].enqueue + 4) < 4) {
      mpi_enc_gen_ref_cfg(_constraint_set,(RK_S32)ref);
    }
    else {
      mpi_enc_gen_smart_gop_ref_cfg
                (_constraint_set,*(RK_S32 *)&mpi[0x1a].reset,*(RK_S32 *)((long)&mpi[0x1a].reset + 4)
                );
    }
    mpp_enc_cfg_set_ptr(_ret,"rc:ref_cfg",_constraint_set);
  }
  mpp_enc_cfg_set_s32(_ret,"tune:anti_flicker_str",mpi[0x1a].reserv[0]);
  mpp_enc_cfg_set_s32(_ret,"tune:atf_str",(p->prep_cfg).sharpen.enable_y);
  mpp_enc_cfg_set_s32(_ret,"tune:atr_str_i",mpi[0x1a].reserv[1]);
  mpp_enc_cfg_set_s32(_ret,"tune:atr_str_p",mpi[0x1a].reserv[2]);
  mpp_enc_cfg_set_s32(_ret,"tune:atl_str",mpi[0x1a].reserv[3]);
  mpp_enc_cfg_set_s32(_ret,"tune:deblur_en",*(undefined4 *)&p->field_0xdc);
  mpp_enc_cfg_set_s32(_ret,"tune:deblur_str",(p->rc_cfg).change);
  mpp_enc_cfg_set_s32(_ret,"tune:sao_str_i",mpi[0x1a].reserv[4]);
  mpp_enc_cfg_set_s32(_ret,"tune:sao_str_p",mpi[0x1a].reserv[5]);
  mpp_enc_cfg_set_s32(_ret,"tune:lambda_idx_p",(p->prep_cfg).sharpen.coef[4]);
  mpp_enc_cfg_set_s32(_ret,"tune:lambda_idx_i",(p->prep_cfg).sharpen.div);
  mpp_enc_cfg_set_s32(_ret,"tune:rc_container",(p->prep_cfg).rotation_ext);
  mpp_enc_cfg_set_s32(_ret,"tune:scene_mode",*(undefined4 *)&mpi[0x1a].control);
  mpp_enc_cfg_set_s32(_ret,"tune:speed",(p->prep_cfg).sharpen.threshold);
  mpp_enc_cfg_set_s32(_ret,"tune:vmaf_opt",0);
  if (*(int *)&p->fp_verify == 4) {
    mpp_enc_cfg_set_st(_ret,"hw:aq_thrd_i",aq_thd_smart);
    mpp_enc_cfg_set_st(_ret,"hw:aq_thrd_p",aq_thd_smart);
    mpp_enc_cfg_set_st(_ret,"hw:aq_step_i",aq_step_smart);
    mpp_enc_cfg_set_st(_ret,"hw:aq_step_p",aq_step_smart);
  }
  else {
    mpp_enc_cfg_set_st(_ret,"hw:aq_thrd_i",aq_thd);
    mpp_enc_cfg_set_st(_ret,"hw:aq_thrd_p",aq_thd);
    mpp_enc_cfg_set_st(_ret,"hw:aq_step_i",aq_step_i_ipc);
    mpp_enc_cfg_set_st(_ret,"hw:aq_step_p",aq_step_p_ipc);
  }
  mpp_enc_cfg_set_st(_ret,"hw:aq_rnge_arr",aq_rnge_arr);
  mpp_enc_cfg_set_s32(_ret,"hw:qbias_en",1);
  mpp_enc_cfg_set_s32(_ret,"hw:qbias_i",(p->prep_cfg).mirroring);
  mpp_enc_cfg_set_s32(_ret,"hw:qbias_p",(p->prep_cfg).mirroring_ext);
  if (mpi[0x19].reserv[7] == 7) {
    mpp_enc_cfg_set_st(_ret,"hw:qbias_arr",qbias_arr_avc);
  }
  else if (mpi[0x19].reserv[7] == 0x1000004) {
    mpp_enc_cfg_set_st(_ret,"hw:qbias_arr",qbias_arr_hevc);
  }
  mpp_enc_cfg_set_s32(_ret,"hw:skip_bias_en",0);
  mpp_enc_cfg_set_s32(_ret,"hw:skip_bias",4);
  mpp_enc_cfg_set_s32(_ret,"hw:skip_sad",8);
  mirroring = (**(code **)((long)ctx + 0x70))(cfg,0x320001,_ret);
  if (mirroring == 0) {
    if ((p->frame_num == 7) || (p->frame_num == 0x1000004)) {
      rc_api_brief.name._0_4_ = p->frame_num;
      pcStack_70 = "default";
      if (*(int *)&p->fp_verify == 4) {
        pcStack_70 = "smart";
      }
      mirroring = (**(code **)((long)ctx + 0x70))(cfg,0x320205,&stack0xffffffffffffff90);
      if (mirroring != 0) {
        _mpp_log_l(2,"mpi_enc_test","mpi control enc set rc api failed ret %d\n",0,mirroring);
        return mirroring;
      }
    }
    mirroring = 0;
    if (_constraint_set != (MppEncRefCfg)0x0) {
      mpp_enc_ref_cfg_deinit(&constraint_set);
    }
    mpp_env_get_u32("sei_mode",&local_74,0);
    mpi[0x19].reserv[0] = local_74;
    mirroring = (**(code **)((long)ctx + 0x70))(cfg,0x32000f,mpi[0x19].reserv);
    if (mirroring == 0) {
      if ((mpi[0x19].reserv[7] == 7) || (mpi[0x19].reserv[7] == 0x1000004)) {
        mpi[0x19].reserv[1] = 1;
        mirroring = (**(code **)((long)ctx + 0x70))(cfg,0x328001,mpi[0x19].reserv + 1);
        if (mirroring != 0) {
          _mpp_log_l(2,"mpi_enc_test","mpi control enc set header mode failed ret %d\n",0,mirroring)
          ;
          return mirroring;
        }
      }
      mpp_env_get_u32("osd_enable",&mpi[0x1a].encode,0);
      mpp_env_get_u32("osd_mode",(undefined1 *)((long)&mpi[0x1a].encode + 4),0);
      mpp_env_get_u32("roi_enable",&mpi[0x1a].isp,0);
      mpp_env_get_u32("user_data_enable",(undefined1 *)((long)&mpi[0x1a].encode_get_packet + 4),0);
      if (((*(int *)&mpi[0x1a].isp != 0) &&
          (mpp_enc_roi_init((MppEncRoiCtx *)(mpi[0x19].reserv + 0xc),mpi[0x19].reserv[2],
                            mpi[0x19].reserv[3],mpi[0x19].reserv[7],4),
          *(long *)(mpi[0x19].reserv + 0xc) == 0)) &&
         (_mpp_log_l(2,"mpi_enc_test","Assertion %s failed at %s:%d\n",0,"p->roi_ctx",
                     "test_mpp_enc_cfg_setup",0x2cb), (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
    }
    else {
      _mpp_log_l(2,"mpi_enc_test","mpi control enc set sei cfg failed ret %d\n",0,mirroring);
    }
  }
  else {
    _mpp_log_l(2,"mpi_enc_test","mpi control enc set cfg failed ret %d\n",0,mirroring);
  }
  return mirroring;
}

Assistant:

MPP_RET test_mpp_enc_cfg_setup(MpiEncMultiCtxInfo *info)
{
    MpiEncTestArgs *cmd = info->cmd;
    MpiEncTestData *p = &info->ctx;
    MppApi *mpi = p->mpi;
    MppCtx ctx = p->ctx;
    MppEncCfg cfg = p->cfg;
    RK_U32 quiet = cmd->quiet;
    MPP_RET ret;
    RK_U32 rotation;
    RK_U32 mirroring;
    RK_U32 flip;
    RK_U32 gop_mode = p->gop_mode;
    MppEncRefCfg ref = NULL;

    /* setup default parameter */
    if (p->fps_in_den == 0)
        p->fps_in_den = 1;
    if (p->fps_in_num == 0)
        p->fps_in_num = 30;
    if (p->fps_out_den == 0)
        p->fps_out_den = 1;
    if (p->fps_out_num == 0)
        p->fps_out_num = 30;

    if (!p->bps)
        p->bps = p->width * p->height / 8 * (p->fps_out_num / p->fps_out_den);

    /* setup preprocess parameters */
    mpp_enc_cfg_set_s32(cfg, "prep:width", p->width);
    mpp_enc_cfg_set_s32(cfg, "prep:height", p->height);
    mpp_enc_cfg_set_s32(cfg, "prep:hor_stride", p->hor_stride);
    mpp_enc_cfg_set_s32(cfg, "prep:ver_stride", p->ver_stride);
    mpp_enc_cfg_set_s32(cfg, "prep:format", p->fmt);
    mpp_enc_cfg_set_s32(cfg, "prep:range", MPP_FRAME_RANGE_JPEG);

    mpp_env_get_u32("mirroring", &mirroring, 0);
    mpp_env_get_u32("rotation", &rotation, 0);
    mpp_env_get_u32("flip", &flip, 0);

    mpp_enc_cfg_set_s32(cfg, "prep:mirroring", mirroring);
    mpp_enc_cfg_set_s32(cfg, "prep:rotation", rotation);
    mpp_enc_cfg_set_s32(cfg, "prep:flip", flip);

    /* setup rate control parameters */
    mpp_enc_cfg_set_s32(cfg, "rc:mode", p->rc_mode);
    mpp_enc_cfg_set_u32(cfg, "rc:max_reenc_times", 0);
    mpp_enc_cfg_set_u32(cfg, "rc:super_mode", 0);

    /* fix input / output frame rate */
    mpp_enc_cfg_set_s32(cfg, "rc:fps_in_flex", p->fps_in_flex);
    mpp_enc_cfg_set_s32(cfg, "rc:fps_in_num", p->fps_in_num);
    mpp_enc_cfg_set_s32(cfg, "rc:fps_in_denom", p->fps_in_den);
    mpp_enc_cfg_set_s32(cfg, "rc:fps_out_flex", p->fps_out_flex);
    mpp_enc_cfg_set_s32(cfg, "rc:fps_out_num", p->fps_out_num);
    mpp_enc_cfg_set_s32(cfg, "rc:fps_out_denom", p->fps_out_den);

    /* drop frame or not when bitrate overflow */
    mpp_enc_cfg_set_u32(cfg, "rc:drop_mode", MPP_ENC_RC_DROP_FRM_DISABLED);
    mpp_enc_cfg_set_u32(cfg, "rc:drop_thd", 20);        /* 20% of max bps */
    mpp_enc_cfg_set_u32(cfg, "rc:drop_gap", 1);         /* Do not continuous drop frame */

    /* setup bitrate for different rc_mode */
    mpp_enc_cfg_set_s32(cfg, "rc:bps_target", p->bps);
    switch (p->rc_mode) {
    case MPP_ENC_RC_MODE_FIXQP : {
        /* do not setup bitrate on FIXQP mode */
    } break;
    case MPP_ENC_RC_MODE_CBR : {
        /* CBR mode has narrow bound */
        mpp_enc_cfg_set_s32(cfg, "rc:bps_max", p->bps_max ? p->bps_max : p->bps * 17 / 16);
        mpp_enc_cfg_set_s32(cfg, "rc:bps_min", p->bps_min ? p->bps_min : p->bps * 15 / 16);
    } break;
    case MPP_ENC_RC_MODE_VBR :
    case MPP_ENC_RC_MODE_AVBR : {
        /* VBR mode has wide bound */
        mpp_enc_cfg_set_s32(cfg, "rc:bps_max", p->bps_max ? p->bps_max : p->bps * 17 / 16);
        mpp_enc_cfg_set_s32(cfg, "rc:bps_min", p->bps_min ? p->bps_min : p->bps * 1 / 16);
    } break;
    default : {
        /* default use CBR mode */
        mpp_enc_cfg_set_s32(cfg, "rc:bps_max", p->bps_max ? p->bps_max : p->bps * 17 / 16);
        mpp_enc_cfg_set_s32(cfg, "rc:bps_min", p->bps_min ? p->bps_min : p->bps * 15 / 16);
    } break;
    }

    /* setup qp for different codec and rc_mode */
    switch (p->type) {
    case MPP_VIDEO_CodingHEVC : {
        switch (p->rc_mode) {
        case MPP_ENC_RC_MODE_FIXQP : {
            RK_S32 fix_qp = cmd->qp_init;

            mpp_enc_cfg_set_s32(cfg, "rc:qp_init", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_max", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_min", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_max_i", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_min_i", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_ip", 0);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_min_i", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_max_i", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_min_p", fix_qp);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_max_p", fix_qp);
        } break;
        case MPP_ENC_RC_MODE_CBR :
        case MPP_ENC_RC_MODE_VBR :
        case MPP_ENC_RC_MODE_AVBR :
        case MPP_ENC_RC_MODE_SMTRC : {
            mpp_enc_cfg_set_s32(cfg, "rc:qp_init", cmd->qp_init ? cmd->qp_init : -1);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_max", cmd->qp_max ? cmd->qp_max : 51);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_min", cmd->qp_min ? cmd->qp_min : 10);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_max_i", cmd->qp_max_i ? cmd->qp_max_i : 51);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_min_i", cmd->qp_min_i ? cmd->qp_min_i : 10);
            mpp_enc_cfg_set_s32(cfg, "rc:qp_ip", 2);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_min_i", cmd->fqp_min_i ? cmd->fqp_min_i : 10);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_max_i", cmd->fqp_max_i ? cmd->fqp_max_i : 45);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_min_p", cmd->fqp_min_p ? cmd->fqp_min_p : 10);
            mpp_enc_cfg_set_s32(cfg, "rc:fqp_max_p", cmd->fqp_max_p ? cmd->fqp_max_p : 45);
        } break;
        default : {
            mpp_err_f("unsupport encoder rc mode %d\n", p->rc_mode);
        } break;
        }
    } break;
    case MPP_VIDEO_CodingVP8 : {
        /* vp8 only setup base qp range */
        mpp_enc_cfg_set_s32(cfg, "rc:qp_init", cmd->qp_init ? cmd->qp_init : 40);
        mpp_enc_cfg_set_s32(cfg, "rc:qp_max",  cmd->qp_max ? cmd->qp_max : 127);
        mpp_enc_cfg_set_s32(cfg, "rc:qp_min",  cmd->qp_min ? cmd->qp_min : 0);
        mpp_enc_cfg_set_s32(cfg, "rc:qp_max_i", cmd->qp_max_i ? cmd->qp_max_i : 127);
        mpp_enc_cfg_set_s32(cfg, "rc:qp_min_i", cmd->qp_min_i ? cmd->qp_min_i : 0);
        mpp_enc_cfg_set_s32(cfg, "rc:qp_ip", 6);
    } break;
    case MPP_VIDEO_CodingMJPEG : {
        /* jpeg use special codec config to control qtable */
        mpp_enc_cfg_set_s32(cfg, "jpeg:q_factor", cmd->qp_init ? cmd->qp_init : 80);
        mpp_enc_cfg_set_s32(cfg, "jpeg:qf_max", cmd->qp_max ? cmd->qp_max : 99);
        mpp_enc_cfg_set_s32(cfg, "jpeg:qf_min", cmd->qp_min ? cmd->qp_min : 1);
    } break;
    default : {
    } break;
    }

    /* setup codec  */
    mpp_enc_cfg_set_s32(cfg, "codec:type", p->type);
    switch (p->type) {
    case MPP_VIDEO_CodingAVC : {
        RK_U32 constraint_set;

        /*
         * H.264 profile_idc parameter
         * 66  - Baseline profile
         * 77  - Main profile
         * 100 - High profile
         */
        mpp_enc_cfg_set_s32(cfg, "h264:profile", 100);
        /*
         * H.264 level_idc parameter
         * 10 / 11 / 12 / 13    - qcif@15fps / cif@7.5fps / cif@15fps / cif@30fps
         * 20 / 21 / 22         - cif@30fps / half-D1@@25fps / D1@12.5fps
         * 30 / 31 / 32         - D1@25fps / 720p@30fps / 720p@60fps
         * 40 / 41 / 42         - 1080p@30fps / 1080p@30fps / 1080p@60fps
         * 50 / 51 / 52         - 4K@30fps
         */
        mpp_enc_cfg_set_s32(cfg, "h264:level", 40);
        mpp_enc_cfg_set_s32(cfg, "h264:cabac_en", 1);
        mpp_enc_cfg_set_s32(cfg, "h264:cabac_idc", 0);
        mpp_enc_cfg_set_s32(cfg, "h264:trans8x8", 1);

        mpp_env_get_u32("constraint_set", &constraint_set, 0);
        if (constraint_set & 0x3f0000)
            mpp_enc_cfg_set_s32(cfg, "h264:constraint_set", constraint_set);
    } break;
    case MPP_VIDEO_CodingHEVC : {
        mpp_enc_cfg_set_s32(cfg, "h265:diff_cu_qp_delta_depth", p->cu_qp_delta_depth);
    } break;
    case MPP_VIDEO_CodingMJPEG :
    case MPP_VIDEO_CodingVP8 : {
    } break;
    default : {
        mpp_err_f("unsupport encoder coding type %d\n", p->type);
    } break;
    }

    p->split_mode = 0;
    p->split_arg = 0;
    p->split_out = 0;

    mpp_env_get_u32("split_mode", &p->split_mode, MPP_ENC_SPLIT_NONE);
    mpp_env_get_u32("split_arg", &p->split_arg, 0);
    mpp_env_get_u32("split_out", &p->split_out, 0);

    if (p->split_mode) {
        mpp_log_q(quiet, "%p split mode %d arg %d out %d\n", ctx,
                  p->split_mode, p->split_arg, p->split_out);
        mpp_enc_cfg_set_s32(cfg, "split:mode", p->split_mode);
        mpp_enc_cfg_set_s32(cfg, "split:arg", p->split_arg);
        mpp_enc_cfg_set_s32(cfg, "split:out", p->split_out);
    }

    // config gop_len and ref cfg
    mpp_enc_cfg_set_s32(cfg, "rc:gop", p->gop_len ? p->gop_len : p->fps_out_num * 2);

    mpp_env_get_u32("gop_mode", &gop_mode, gop_mode);
    if (gop_mode) {
        mpp_enc_ref_cfg_init(&ref);

        if (p->gop_mode < 4)
            mpi_enc_gen_ref_cfg(ref, gop_mode);
        else
            mpi_enc_gen_smart_gop_ref_cfg(ref, p->gop_len, p->vi_len);

        mpp_enc_cfg_set_ptr(cfg, "rc:ref_cfg", ref);
    }

    /* setup fine tuning paramters */
    mpp_enc_cfg_set_s32(cfg, "tune:anti_flicker_str", p->anti_flicker_str);
    mpp_enc_cfg_set_s32(cfg, "tune:atf_str", cmd->atf_str);
    mpp_enc_cfg_set_s32(cfg, "tune:atr_str_i", p->atr_str_i);
    mpp_enc_cfg_set_s32(cfg, "tune:atr_str_p", p->atr_str_p);
    mpp_enc_cfg_set_s32(cfg, "tune:atl_str", p->atl_str);
    mpp_enc_cfg_set_s32(cfg, "tune:deblur_en", cmd->deblur_en);
    mpp_enc_cfg_set_s32(cfg, "tune:deblur_str", cmd->deblur_str);
    mpp_enc_cfg_set_s32(cfg, "tune:sao_str_i", p->sao_str_i);
    mpp_enc_cfg_set_s32(cfg, "tune:sao_str_p", p->sao_str_p);
    mpp_enc_cfg_set_s32(cfg, "tune:lambda_idx_p", cmd->lambda_idx_p);
    mpp_enc_cfg_set_s32(cfg, "tune:lambda_idx_i", cmd->lambda_idx_i);
    mpp_enc_cfg_set_s32(cfg, "tune:rc_container", cmd->rc_container);
    mpp_enc_cfg_set_s32(cfg, "tune:scene_mode", p->scene_mode);
    mpp_enc_cfg_set_s32(cfg, "tune:speed", cmd->speed);
    mpp_enc_cfg_set_s32(cfg, "tune:vmaf_opt", 0);

    /* setup hardware specified parameters */
    if (cmd->rc_mode == MPP_ENC_RC_MODE_SMTRC) {
        mpp_enc_cfg_set_st(cfg, "hw:aq_thrd_i", aq_thd_smart);
        mpp_enc_cfg_set_st(cfg, "hw:aq_thrd_p", aq_thd_smart);
        mpp_enc_cfg_set_st(cfg, "hw:aq_step_i", aq_step_smart);
        mpp_enc_cfg_set_st(cfg, "hw:aq_step_p", aq_step_smart);
    } else {
        mpp_enc_cfg_set_st(cfg, "hw:aq_thrd_i", aq_thd);
        mpp_enc_cfg_set_st(cfg, "hw:aq_thrd_p", aq_thd);
        mpp_enc_cfg_set_st(cfg, "hw:aq_step_i", aq_step_i_ipc);
        mpp_enc_cfg_set_st(cfg, "hw:aq_step_p", aq_step_p_ipc);
    }
    mpp_enc_cfg_set_st(cfg, "hw:aq_rnge_arr", aq_rnge_arr);

    mpp_enc_cfg_set_s32(cfg, "hw:qbias_en", 1);
    mpp_enc_cfg_set_s32(cfg, "hw:qbias_i", cmd->bias_i);
    mpp_enc_cfg_set_s32(cfg, "hw:qbias_p", cmd->bias_p);

    if (p->type == MPP_VIDEO_CodingAVC) {
        mpp_enc_cfg_set_st(cfg, "hw:qbias_arr", qbias_arr_avc);
    } else if (p->type == MPP_VIDEO_CodingHEVC) {
        mpp_enc_cfg_set_st(cfg, "hw:qbias_arr", qbias_arr_hevc);
    }

    mpp_enc_cfg_set_s32(cfg, "hw:skip_bias_en", 0);
    mpp_enc_cfg_set_s32(cfg, "hw:skip_bias", 4);
    mpp_enc_cfg_set_s32(cfg, "hw:skip_sad", 8);

    ret = mpi->control(ctx, MPP_ENC_SET_CFG, cfg);
    if (ret) {
        mpp_err("mpi control enc set cfg failed ret %d\n", ret);
        goto RET;
    }

    if (cmd->type == MPP_VIDEO_CodingAVC || cmd->type == MPP_VIDEO_CodingHEVC) {
        RcApiBrief rc_api_brief;
        rc_api_brief.type = cmd->type;
        rc_api_brief.name = (cmd->rc_mode == MPP_ENC_RC_MODE_SMTRC) ?
                            "smart" : "default";

        ret = mpi->control(ctx, MPP_ENC_SET_RC_API_CURRENT, &rc_api_brief);
        if (ret) {
            mpp_err("mpi control enc set rc api failed ret %d\n", ret);
            goto RET;
        }
    }

    if (ref)
        mpp_enc_ref_cfg_deinit(&ref);

    /* optional */
    {
        RK_U32 sei_mode;

        mpp_env_get_u32("sei_mode", &sei_mode, MPP_ENC_SEI_MODE_DISABLE);
        p->sei_mode = sei_mode;
        ret = mpi->control(ctx, MPP_ENC_SET_SEI_CFG, &p->sei_mode);
        if (ret) {
            mpp_err("mpi control enc set sei cfg failed ret %d\n", ret);
            goto RET;
        }
    }

    if (p->type == MPP_VIDEO_CodingAVC || p->type == MPP_VIDEO_CodingHEVC) {
        p->header_mode = MPP_ENC_HEADER_MODE_EACH_IDR;
        ret = mpi->control(ctx, MPP_ENC_SET_HEADER_MODE, &p->header_mode);
        if (ret) {
            mpp_err("mpi control enc set header mode failed ret %d\n", ret);
            goto RET;
        }
    }

    /* setup test mode by env */
    mpp_env_get_u32("osd_enable", &p->osd_enable, 0);
    mpp_env_get_u32("osd_mode", &p->osd_mode, MPP_ENC_OSD_PLT_TYPE_DEFAULT);
    mpp_env_get_u32("roi_enable", &p->roi_enable, 0);
    mpp_env_get_u32("user_data_enable", &p->user_data_enable, 0);

    if (p->roi_enable) {
        mpp_enc_roi_init(&p->roi_ctx, p->width, p->height, p->type, 4);
        mpp_assert(p->roi_ctx);
    }

RET:
    return ret;
}